

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O2

void __thiscall Jinx::Impl::BinaryWriter::Write(BinaryWriter *this,void *val,size_t bytes)

{
  Buffer::Write((this->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                ,&this->m_pos,val,bytes);
  return;
}

Assistant:

void Write(const void * val, size_t bytes) { m_buffer->Write(&m_pos, val, bytes); }